

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_f8ef36::DummySignatureCreator::CreateSig
          (DummySignatureCreator *this,SigningProvider *provider,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchSig,CKeyID *keyid,
          CScript *scriptCode,SigVersion sigversion)

{
  long in_FS_OFFSET;
  value_type_conflict local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_19 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_assign
            (vchSig,(long)this->m_r_len + 7 + (long)this->m_s_len,&local_19);
  *(vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
   super__Vector_impl_data._M_start = '0';
  (vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start[1] = this->m_r_len + this->m_s_len + '\x04';
  (vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start[2] = '\x02';
  (vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start[3] = this->m_r_len;
  (vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start[4] = '\x01';
  (vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start[(long)this->m_r_len + 4] = '\x02';
  (vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start[(long)this->m_r_len + 5] = this->m_s_len;
  (vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start[(long)this->m_r_len + 6] = '\x01';
  (vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start[(long)this->m_s_len + 6 + (long)this->m_r_len] = '\x01';
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool CreateSig(const SigningProvider& provider, std::vector<unsigned char>& vchSig, const CKeyID& keyid, const CScript& scriptCode, SigVersion sigversion) const override
    {
        // Create a dummy signature that is a valid DER-encoding
        vchSig.assign(m_r_len + m_s_len + 7, '\000');
        vchSig[0] = 0x30;
        vchSig[1] = m_r_len + m_s_len + 4;
        vchSig[2] = 0x02;
        vchSig[3] = m_r_len;
        vchSig[4] = 0x01;
        vchSig[4 + m_r_len] = 0x02;
        vchSig[5 + m_r_len] = m_s_len;
        vchSig[6 + m_r_len] = 0x01;
        vchSig[6 + m_r_len + m_s_len] = SIGHASH_ALL;
        return true;
    }